

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall glslang::TSmallArrayVector::pop_front(TSmallArrayVector *this)

{
  vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_> *this_00;
  size_type sVar1;
  bool bVar2;
  __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
  local_20;
  const_iterator local_18;
  TSmallArrayVector *local_10;
  TSmallArrayVector *this_local;
  
  bVar2 = false;
  local_10 = this;
  if (this->sizes != (TVector<glslang::TArraySize> *)0x0) {
    sVar1 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::size
                      (&this->sizes->
                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      );
    bVar2 = sVar1 != 0;
  }
  if (!bVar2) {
    __assert_fail("sizes != nullptr && sizes->size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0x8f,"void glslang::TSmallArrayVector::pop_front()");
  }
  sVar1 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::size
                    (&this->sizes->
                      super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                    );
  if (sVar1 == 1) {
    dealloc(this);
  }
  else {
    this_00 = &this->sizes->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>;
    local_20._M_current =
         (TArraySize *)
         std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::begin
                   (&this->sizes->
                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                   );
    __gnu_cxx::
    __normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
    ::__normal_iterator<glslang::TArraySize*>
              ((__normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
                *)&local_18,&local_20);
    std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::erase
              (this_00,local_18);
  }
  return;
}

Assistant:

void pop_front()
    {
        assert(sizes != nullptr && sizes->size() > 0);
        if (sizes->size() == 1)
            dealloc();
        else
            sizes->erase(sizes->begin());
    }